

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O0

void end_pass(gdmf *d)

{
  bool bVar1;
  long *in_RDI;
  vw *all;
  size_t in_stack_00000140;
  string *in_stack_00000148;
  vw *in_stack_00000150;
  size_t *in_stack_ffffffffffffff80;
  vw *in_stack_ffffffffffffff88;
  string local_60 [48];
  string local_30 [32];
  long local_10;
  long *local_8;
  
  local_10 = *in_RDI;
  *(float *)(local_10 + 0x3560) = *(float *)(local_10 + 0x3564) * *(float *)(local_10 + 0x3560);
  local_8 = in_RDI;
  if ((*(byte *)(local_10 + 0x90) & 1) != 0) {
    std::__cxx11::string::string(local_30,(string *)(local_10 + 0x3570));
    save_predictor(in_stack_00000150,in_stack_00000148,in_stack_00000140);
    std::__cxx11::string::~string(local_30);
  }
  if ((*(byte *)(local_10 + 0x3457) & 1) == 0) {
    bVar1 = summarize_holdout_set(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    if (bVar1) {
      std::__cxx11::string::string(local_60,(string *)(local_10 + 0x3570));
      finalize_regressor((vw *)d,(string *)all);
      std::__cxx11::string::~string(local_60);
    }
    if ((local_8[7] == local_8[6]) &&
       ((*(ulong *)(local_10 + 0x3468) < 2 ||
        (*(ulong *)(local_10 + 0x48) % *(ulong *)(local_10 + 0x3468) == 0)))) {
      set_done((vw *)0x240ce7);
    }
  }
  return;
}

Assistant:

void end_pass(gdmf& d)
{
  vw* all = d.all;

  all->eta *= all->eta_decay_rate;
  if (all->save_per_pass)
    save_predictor(*all, all->final_regressor_name, all->current_pass);

  if (!all->holdout_set_off)
  {
    if (summarize_holdout_set(*all, d.no_win_counter))
      finalize_regressor(*all, all->final_regressor_name);
    if ((d.early_stop_thres == d.no_win_counter) &&
        ((all->check_holdout_every_n_passes <= 1) || ((all->current_pass % all->check_holdout_every_n_passes) == 0)))
      set_done(*all);
  }
}